

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimizedInterleavePatterns.cpp
# Opt level: O0

void anon_unknown.dwarf_1d2162::runtests(bool nonfatal,bool tiny)

{
  ostream *poVar1;
  byte in_SIL;
  byte in_DIL;
  int j;
  int skipped;
  int i;
  undefined1 in_stack_00000256;
  undefined1 in_stack_00000257;
  Schema in_stack_00000260;
  Schema in_stack_00000290;
  undefined1 local_78 [48];
  undefined1 local_48 [48];
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  int local_8;
  byte local_2;
  byte local_1;
  
  local_1 = in_DIL & 1;
  local_2 = in_SIL & 1;
  random_reseed(0);
  local_8 = 0;
  local_c = 0;
  (anonymous_namespace)::gFailures = 0;
  (anonymous_namespace)::gSuccesses = 0;
  (anonymous_namespace)::gOptimisedReads = 0;
  while (*(long *)((anonymous_namespace)::Schemes + (long)local_8 * 0x30) != 0) {
    local_10 = 0;
    while (*(long *)((anonymous_namespace)::Schemes + (long)local_10 * 0x30) != 0) {
      poVar1 = (ostream *)std::ostream::operator<<(&std::cout,std::right);
      local_14 = (int)std::setw(2);
      poVar1 = std::operator<<(poVar1,(_Setw)local_14);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_8);
      poVar1 = std::operator<<(poVar1,',');
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::right);
      local_18 = (int)std::setw(2);
      poVar1 = std::operator<<(poVar1,(_Setw)local_18);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10);
      std::operator<<(poVar1,": ");
      std::ostream::flush();
      if ((local_1 & 1) == 0) {
        memcpy(local_48,(anonymous_namespace)::Schemes + (long)local_8 * 0x30,0x30);
        memcpy(local_78,(anonymous_namespace)::Schemes + (long)local_10 * 0x30,0x30);
        test(in_stack_00000260,in_stack_00000290,(bool)in_stack_00000257,(bool)in_stack_00000256);
      }
      else {
        poVar1 = std::operator<<((ostream *)&std::cout," skipping ");
        poVar1 = std::operator<<(poVar1,*(char **)((anonymous_namespace)::Schemes +
                                                  (long)local_8 * 0x30));
        poVar1 = std::operator<<(poVar1,',');
        poVar1 = std::operator<<(poVar1,*(char **)((anonymous_namespace)::Schemes +
                                                  (long)local_10 * 0x30));
        std::operator<<(poVar1,": known to crash\n");
        local_c = local_c + 1;
      }
      local_10 = local_10 + 1;
    }
    local_8 = local_8 + 1;
  }
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,(anonymous_namespace)::gFailures);
  poVar1 = std::operator<<(poVar1,'/');
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(anonymous_namespace)::gSuccesses + (anonymous_namespace)::gFailures);
  std::operator<<(poVar1," runs failed\n");
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,local_c);
  std::operator<<(poVar1," tests skipped (assumed to be bad)\n");
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,(anonymous_namespace)::gOptimisedReads);
  poVar1 = std::operator<<(poVar1,'/');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(anonymous_namespace)::gSuccesses);
  std::operator<<(poVar1," optimised\n");
  if (0 < (anonymous_namespace)::gFailures) {
    std::operator<<((ostream *)&std::cout," TESTS FAILED\n");
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testOptimizedInterleavePatterns.cpp"
                  ,0x281,"void (anonymous namespace)::runtests(bool, bool)");
  }
  return;
}

Assistant:

void
runtests (bool nonfatal, bool tiny)
{
    random_reseed (1);
    int i       = 0;
    int skipped = 0;

    gFailures       = 0;
    gSuccesses      = 0;
    gOptimisedReads = 0;

    while (Schemes[i]._name != NULL)
    {
        int j = 0;
        while (Schemes[j]._name != NULL)
        {
            cout << right << setw (2) << i << ',' << right << setw (2) << j
                 << ": ";
            cout.flush ();

            if (nonfatal)
            {
                cout << " skipping " << Schemes[i]._name << ','
                     << Schemes[j]._name << ": known to crash\n";
                skipped++;
            }
            else
            {
                test (Schemes[i], Schemes[j], nonfatal, tiny);
            }
            j++;
        }
        i++;
    }

    cout << gFailures << '/' << (gSuccesses + gFailures) << " runs failed\n";
    cout << skipped << " tests skipped (assumed to be bad)\n";
    cout << gOptimisedReads << '/' << gSuccesses << " optimised\n";

    if (gFailures > 0)
    {
        cout << " TESTS FAILED\n";
        assert (false);
    }
}